

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getinfo.c
# Opt level: O0

CURLcode getinfo_char(Curl_easy *data,CURLINFO info,char **param_charp)

{
  char *local_40;
  char *local_30;
  char *m;
  char **param_charp_local;
  CURLINFO info_local;
  Curl_easy *data_local;
  
  switch(info) {
  case CURLINFO_EFFECTIVE_URL:
    if ((data->state).url == (char *)0x0) {
      local_40 = "";
    }
    else {
      local_40 = (data->state).url;
    }
    *param_charp = local_40;
    break;
  default:
    return CURLE_UNKNOWN_OPTION;
  case CURLINFO_CONTENT_TYPE:
    *param_charp = (data->info).contenttype;
    break;
  case CURLINFO_PRIVATE:
    *param_charp = (char *)(data->set).private_data;
    break;
  case CURLINFO_FTP_ENTRY_PATH:
    *param_charp = (data->state).most_recent_ftp_entrypath;
    break;
  case CURLINFO_REDIRECT_URL:
    *param_charp = (data->info).wouldredirect;
    break;
  case CURLINFO_PRIMARY_IP:
    *param_charp = (data->info).primary.remote_ip;
    break;
  case CURLINFO_RTSP_SESSION_ID:
    *param_charp = (data->set).str[0x33];
    break;
  case CURLINFO_LOCAL_IP:
    *param_charp = (data->info).primary.local_ip;
    break;
  case CURLINFO_SCHEME:
    *param_charp = (data->info).conn_scheme;
    break;
  case CURLINFO_EFFECTIVE_METHOD:
    local_30 = (data->set).str[0x1c];
    if (local_30 == (char *)0x0) {
      if ((*(ulong *)&(data->set).field_0x89c >> 0x1d & 1) == 0) {
        switch((data->state).httpreq) {
        default:
          local_30 = "GET";
          break;
        case '\x01':
        case '\x02':
        case '\x03':
          local_30 = "POST";
          break;
        case '\x04':
          local_30 = "PUT";
          break;
        case '\x05':
          local_30 = "HEAD";
        }
      }
      else {
        local_30 = "HEAD";
      }
    }
    *param_charp = local_30;
    break;
  case CURLINFO_REFERER:
    *param_charp = (data->state).referer;
    break;
  case CURLINFO_CAINFO:
    *param_charp = "/etc/ssl/certs/ca-certificates.crt";
    break;
  case CURLINFO_CAPATH:
    *param_charp = "/etc/ssl/certs";
  }
  return CURLE_OK;
}

Assistant:

static CURLcode getinfo_char(struct Curl_easy *data, CURLINFO info,
                             const char **param_charp)
{
  switch(info) {
  case CURLINFO_EFFECTIVE_URL:
    *param_charp = data->state.url ? data->state.url : "";
    break;
  case CURLINFO_EFFECTIVE_METHOD: {
    const char *m = data->set.str[STRING_CUSTOMREQUEST];
    if(!m) {
      if(data->set.opt_no_body)
        m = "HEAD";
#ifndef CURL_DISABLE_HTTP
      else {
        switch(data->state.httpreq) {
        case HTTPREQ_POST:
        case HTTPREQ_POST_FORM:
        case HTTPREQ_POST_MIME:
          m = "POST";
          break;
        case HTTPREQ_PUT:
          m = "PUT";
          break;
        default: /* this should never happen */
        case HTTPREQ_GET:
          m = "GET";
          break;
        case HTTPREQ_HEAD:
          m = "HEAD";
          break;
        }
      }
#endif
    }
    *param_charp = m;
  }
    break;
  case CURLINFO_CONTENT_TYPE:
    *param_charp = data->info.contenttype;
    break;
  case CURLINFO_PRIVATE:
    *param_charp = (char *) data->set.private_data;
    break;
  case CURLINFO_FTP_ENTRY_PATH:
    /* Return the entrypath string from the most recent connection.
       This pointer was copied from the connectdata structure by FTP.
       The actual string may be free()ed by subsequent libcurl calls so
       it must be copied to a safer area before the next libcurl call.
       Callers must never free it themselves. */
    *param_charp = data->state.most_recent_ftp_entrypath;
    break;
  case CURLINFO_REDIRECT_URL:
    /* Return the URL this request would have been redirected to if that
       option had been enabled! */
    *param_charp = data->info.wouldredirect;
    break;
  case CURLINFO_REFERER:
    /* Return the referrer header for this request, or NULL if unset */
    *param_charp = data->state.referer;
    break;
  case CURLINFO_PRIMARY_IP:
    /* Return the ip address of the most recent (primary) connection */
    *param_charp = data->info.primary.remote_ip;
    break;
  case CURLINFO_LOCAL_IP:
    /* Return the source/local ip address of the most recent (primary)
       connection */
    *param_charp = data->info.primary.local_ip;
    break;
  case CURLINFO_RTSP_SESSION_ID:
#ifndef CURL_DISABLE_RTSP
    *param_charp = data->set.str[STRING_RTSP_SESSION_ID];
#else
    *param_charp = NULL;
#endif
    break;
  case CURLINFO_SCHEME:
    *param_charp = data->info.conn_scheme;
    break;
  case CURLINFO_CAPATH:
#ifdef CURL_CA_PATH
    *param_charp = CURL_CA_PATH;
#else
    *param_charp = NULL;
#endif
    break;
  case CURLINFO_CAINFO:
#ifdef CURL_CA_BUNDLE
    *param_charp = CURL_CA_BUNDLE;
#else
    *param_charp = NULL;
#endif
    break;
  default:
    return CURLE_UNKNOWN_OPTION;
  }

  return CURLE_OK;
}